

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O1

void readlargeobjects(uint32 numlargeobjects,uint32 numsmallobjects,uint8 **ptr,uint32 *len,
                     MOJOSHADER_effect *effect,char *profile,MOJOSHADER_swizzle *swiz,uint swizcount
                     ,MOJOSHADER_samplerMap *smap,uint smapcount,MOJOSHADER_malloc m,
                     MOJOSHADER_free f,void *d)

{
  MOJOSHADER_effectObject *pMVar1;
  MOJOSHADER_symbolType MVar2;
  uint *puVar3;
  MOJOSHADER_effectParam *pMVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  void *pvVar9;
  MOJOSHADER_parseData *pMVar10;
  MOJOSHADER_preshader *pMVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint32 uVar18;
  MOJOSHADER_effectState *pMVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  char *local_78;
  char mainfn [32];
  
  if (numlargeobjects != 0) {
    iVar6 = numsmallobjects + numlargeobjects + 1;
    iVar15 = numsmallobjects + 1;
    if (iVar15 < iVar6) {
      do {
        uVar14 = *len;
        uVar16 = 0;
        uVar7 = 0;
        if (3 < uVar14) {
          uVar7 = *(uint *)*ptr;
          *ptr = (uint8 *)((long)*ptr + 4);
          uVar16 = uVar14 - 4;
        }
        *len = uVar16;
        uVar17 = 0;
        uVar12 = 0;
        uVar14 = 0;
        if (3 < uVar16) {
          uVar14 = *(uint *)*ptr;
          *ptr = (uint8 *)((long)*ptr + 4);
          uVar12 = uVar16 - 4;
        }
        *len = uVar12;
        if (3 < uVar12) {
          *ptr = *ptr + 4;
          uVar17 = uVar12 - 4;
        }
        *len = uVar17;
        uVar16 = 0;
        if (uVar17 < 4) {
          uVar17 = 0;
          uVar21 = 0;
        }
        else {
          uVar21 = (ulong)*(uint *)*ptr;
          *ptr = (uint8 *)((long)*ptr + 4);
          uVar17 = uVar17 - 4;
        }
        *len = uVar17;
        bVar23 = false;
        if (3 < uVar17) {
          iVar8 = *(int *)*ptr;
          *ptr = (uint8 *)((long)*ptr + 4);
          uVar16 = uVar17 - 4;
          bVar23 = iVar8 == 2;
        }
        *len = uVar16;
        uVar18 = 0;
        uVar12 = 0;
        if (3 < uVar16) {
          uVar12 = *(uint *)*ptr;
          *ptr = (uint8 *)((long)*ptr + 4);
          uVar18 = uVar16 - 4;
        }
        *len = uVar18;
        if (uVar7 == 0xffffffff) {
          pMVar19 = (MOJOSHADER_effectState *)effect->params[uVar14].value.field_4.values;
        }
        else {
          pMVar19 = effect->techniques[uVar7].passes[uVar14].states;
        }
        pMVar1 = effect->objects + *pMVar19[uVar21].value.field_4.valuesZBT;
        MVar2 = pMVar1->type;
        if (MVar2 - MOJOSHADER_SYMTYPE_SAMPLER < 5) {
          if (uVar12 != 0) {
            pvVar9 = (*m)(uVar12,d);
            memcpy(pvVar9,*ptr,(ulong)uVar12);
            *(void **)((long)pMVar1 + 8) = pvVar9;
          }
        }
        else if (MVar2 - MOJOSHADER_SYMTYPE_PIXELSHADER < 2) {
          *(uint *)((long)pMVar1 + 4) = uVar7;
          *(uint *)((long)pMVar1 + 8) = uVar14;
          if (bVar23) {
            *(int *)((long)pMVar1 + 0xc) = 1;
            puVar3 = (uint *)*ptr;
            uVar14 = *puVar3;
            if ((ulong)uVar14 == 0) {
              local_78 = (char *)0x0;
            }
            else {
              local_78 = (char *)(*m)(uVar14,d);
              memcpy(local_78,puVar3 + 1,(ulong)uVar14);
            }
            *(int *)((long)pMVar1 + 0x20) = 1;
            pvVar9 = (*m)(4,d);
            *(void **)((long)pMVar1 + 0x28) = pvVar9;
            iVar8 = findparameter(effect->params,effect->param_count,local_78);
            **(int **)((long)pMVar1 + 0x28) = iVar8;
            (*f)(local_78,d);
            pMVar11 = MOJOSHADER_parsePreshader(*ptr + (uVar14 + 4),uVar12 - 0x10,m,f,d);
            *(MOJOSHADER_preshader **)((long)pMVar1 + 0x40) = pMVar11;
            uVar14 = pMVar11->symbol_count;
            *(uint *)((long)pMVar1 + 0x10) = uVar14;
            pvVar9 = (*m)(uVar14 << 2,d);
            *(void **)((long)pMVar1 + 0x18) = pvVar9;
            lVar13 = *(long *)((long)pMVar1 + 0x40);
            if (*(int *)(lVar13 + 0x14) != 0) {
              lVar22 = 0;
              uVar21 = 0;
              do {
                iVar8 = findparameter(effect->params,effect->param_count,
                                      *(char **)(*(long *)(lVar13 + 0x18) + lVar22));
                *(int *)(*(long *)((long)pMVar1 + 0x18) + uVar21 * 4) = iVar8;
                uVar21 = uVar21 + 1;
                lVar13 = *(long *)((long)pMVar1 + 0x40);
                lVar22 = lVar22 + 0x38;
              } while (uVar21 < *(uint *)(lVar13 + 0x14));
            }
          }
          else {
            snprintf(mainfn,0x20,"ShaderFunction%u");
            pMVar10 = MOJOSHADER_parse(profile,mainfn,*ptr,uVar12,swiz,swizcount,smap,smapcount,m,f,
                                       d);
            *(MOJOSHADER_parseData **)((long)pMVar1 + 0x40) = pMVar10;
            iVar8 = pMVar10->symbol_count;
            if (0 < iVar8) {
              lVar13 = 8;
              lVar22 = 0;
              do {
                if (*(int *)((long)&pMVar10->symbols->name + lVar13) == 3) {
                  *(int *)((long)pMVar1 + 0x30) = *(int *)((long)pMVar1 + 0x30) + 1;
                }
                lVar22 = lVar22 + 1;
                pMVar10 = *(MOJOSHADER_parseData **)((long)pMVar1 + 0x40);
                iVar8 = pMVar10->symbol_count;
                lVar13 = lVar13 + 0x38;
              } while (lVar22 < iVar8);
            }
            *(int *)((long)pMVar1 + 0x20) = iVar8;
            pvVar9 = (*m)(iVar8 << 2,d);
            *(void **)((long)pMVar1 + 0x28) = pvVar9;
            pvVar9 = (*m)(*(int *)((long)pMVar1 + 0x30) * 0x18,d);
            *(void **)((long)pMVar1 + 0x38) = pvVar9;
            lVar13 = *(long *)((long)pMVar1 + 0x40);
            if (0 < *(int *)(lVar13 + 0xa0)) {
              lVar22 = 0;
              lVar20 = 0;
              uVar21 = 0;
              do {
                iVar8 = findparameter(effect->params,effect->param_count,
                                      *(char **)(*(long *)(lVar13 + 0xa8) + lVar22));
                *(int *)(*(long *)((long)pMVar1 + 0x28) + lVar20 * 4) = iVar8;
                lVar13 = *(long *)(*(long *)((long)pMVar1 + 0x40) + 0xa8);
                if (*(int *)(lVar13 + 8 + lVar22) == 3) {
                  lVar5 = uVar21 * 0x18;
                  *(undefined8 *)(*(long *)((long)pMVar1 + 0x38) + lVar5) =
                       *(undefined8 *)(lVar13 + lVar22);
                  *(undefined4 *)(*(long *)((long)pMVar1 + 0x38) + 8 + lVar5) =
                       *(undefined4 *)
                        (*(long *)(*(long *)((long)pMVar1 + 0x40) + 0xa8) + 0xc + lVar22);
                  pMVar4 = effect->params;
                  *(uint *)(*(long *)((long)pMVar1 + 0x38) + 0xc + lVar5) =
                       pMVar4[iVar8].value.value_count;
                  *(anon_union_8_20_d40dc30a_for_MOJOSHADER_effectValue_4 *)
                   (*(long *)((long)pMVar1 + 0x38) + 0x10 + lVar5) = pMVar4[iVar8].value.field_4;
                  uVar21 = (ulong)((int)uVar21 + 1);
                }
                lVar20 = lVar20 + 1;
                lVar13 = *(long *)((long)pMVar1 + 0x40);
                lVar22 = lVar22 + 0x38;
              } while (lVar20 < *(int *)(lVar13 + 0xa0));
            }
            if (*(long *)(lVar13 + 0xb0) != 0) {
              iVar8 = *(int *)(*(long *)(lVar13 + 0xb0) + 0x14);
              *(int *)((long)pMVar1 + 0x10) = iVar8;
              pvVar9 = (*m)(iVar8 << 2,d);
              *(void **)((long)pMVar1 + 0x18) = pvVar9;
              lVar13 = *(long *)(*(long *)((long)pMVar1 + 0x40) + 0xb0);
              if (*(int *)(lVar13 + 0x14) != 0) {
                lVar22 = 0;
                uVar21 = 0;
                do {
                  iVar8 = findparameter(effect->params,effect->param_count,
                                        *(char **)(*(long *)(lVar13 + 0x18) + lVar22));
                  *(int *)(*(long *)((long)pMVar1 + 0x18) + uVar21 * 4) = iVar8;
                  uVar21 = uVar21 + 1;
                  lVar13 = *(long *)(*(long *)((long)pMVar1 + 0x40) + 0xb0);
                  lVar22 = lVar22 + 0x38;
                } while (uVar21 < *(uint *)(lVar13 + 0x14));
              }
            }
          }
        }
        else if (MVar2 != MOJOSHADER_SYMTYPE_VOID) {
          __assert_fail("0 && \"Large object type unknown!\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                        ,0x33a,
                        "void readlargeobjects(const uint32, const uint32, const uint8 **, uint32 *, MOJOSHADER_effect *, const char *, const MOJOSHADER_swizzle *, const unsigned int, const MOJOSHADER_samplerMap *, const unsigned int, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                       );
        }
        uVar14 = uVar12 + 3 & 0xfffffffc;
        *ptr = *ptr + uVar14;
        *len = *len - uVar14;
        iVar15 = iVar15 + 1;
      } while (iVar15 != iVar6);
    }
  }
  return;
}

Assistant:

static void readlargeobjects(const uint32 numlargeobjects,
                             const uint32 numsmallobjects,
                             const uint8 **ptr,
                             uint32 *len,
                             MOJOSHADER_effect *effect,
                             const char *profile,
                             const MOJOSHADER_swizzle *swiz,
                             const unsigned int swizcount,
                             const MOJOSHADER_samplerMap *smap,
                             const unsigned int smapcount,
                             MOJOSHADER_malloc m,
                             MOJOSHADER_free f,
                             void *d)
{
    int i, j;
    if (numlargeobjects == 0) return;

    int numobjects = numsmallobjects + numlargeobjects + 1;
    for (i = numsmallobjects + 1; i < numobjects; i++)
    {
        const uint32 technique = readui32(ptr, len);
        const uint32 index = readui32(ptr, len);
        /*const uint32 FIXME =*/ readui32(ptr, len);
        const uint32 state = readui32(ptr, len);
        const uint32 type = readui32(ptr, len);
        const uint32 length = readui32(ptr, len);

        uint32 objectIndex;
        if (technique == -1)
            objectIndex = effect->params[index].value.valuesSS[state].value.valuesI[0];
        else
            objectIndex = effect->techniques[technique].passes[index].states[state].value.valuesI[0];

        MOJOSHADER_effectObject *object = &effect->objects[objectIndex];
        if (object->type == MOJOSHADER_SYMTYPE_PIXELSHADER
         || object->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)
        {
            object->shader.technique = technique;
            object->shader.pass = index;

            const char *emitter = profile;
            if (type == 2)
            {
                /* This is a standalone preshader!
                 * It exists solely for effect passes that do not use a single
                 * vertex/fragment shader.
                 */
                object->shader.is_preshader = 1;
                const uint32 start = *((uint32 *) *ptr) + 4;
                const uint32 end = 16; // FIXME: Why? -flibit
                const char *array = readstring(*ptr, 0, m, d);
                object->shader.param_count = 1;
                object->shader.params = (uint32 *) m(sizeof (uint32), d);
                object->shader.params[0] = findparameter(effect->params,
                                                         effect->param_count,
                                                         array);
                f((void *) array, d);
                object->shader.preshader = MOJOSHADER_parsePreshader(*ptr + start, length - end,
                                                                     m, f, d);
                // !!! FIXME: check for errors.
                object->shader.preshader_param_count = object->shader.preshader->symbol_count;
                object->shader.preshader_params = (uint32 *) m(object->shader.preshader_param_count * sizeof (uint32), d);
                for (j = 0; j < object->shader.preshader->symbol_count; j++)
                {
                    object->shader.preshader_params[j] = findparameter(effect->params,
                                                                       effect->param_count,
                                                                       object->shader.preshader->symbols[j].name);
                } // for
            } // if
            else
            {
                char mainfn[32];
                snprintf(mainfn, sizeof (mainfn), "ShaderFunction%u", (unsigned int) objectIndex);
                object->shader.shader = MOJOSHADER_parse(emitter, mainfn, *ptr, length,
                                                         swiz, swizcount, smap, smapcount,
                                                         m, f, d);
                // !!! FIXME: check for errors.
                for (j = 0; j < object->shader.shader->symbol_count; j++)
                    if (object->shader.shader->symbols[j].register_set == MOJOSHADER_SYMREGSET_SAMPLER)
                        object->shader.sampler_count++;
                object->shader.param_count = object->shader.shader->symbol_count;
                object->shader.params = (uint32 *) m(object->shader.param_count * sizeof (uint32), d);
                object->shader.samplers = (MOJOSHADER_samplerStateRegister *) m(object->shader.sampler_count * sizeof (MOJOSHADER_samplerStateRegister), d);
                uint32 curSampler = 0;
                for (j = 0; j < object->shader.shader->symbol_count; j++)
                {
                    int par = findparameter(effect->params,
                                            effect->param_count,
                                            object->shader.shader->symbols[j].name);
                    object->shader.params[j] = par;
                    if (object->shader.shader->symbols[j].register_set == MOJOSHADER_SYMREGSET_SAMPLER)
                    {
                        object->shader.samplers[curSampler].sampler_name = object->shader.shader->symbols[j].name;
                        object->shader.samplers[curSampler].sampler_register = object->shader.shader->symbols[j].register_index;
                        object->shader.samplers[curSampler].sampler_state_count = effect->params[par].value.value_count;
                        object->shader.samplers[curSampler].sampler_states = effect->params[par].value.valuesSS;
                        curSampler++;
                    } // if
                } // for
                if (object->shader.shader->preshader)
                {
                    object->shader.preshader_param_count = object->shader.shader->preshader->symbol_count;
                    object->shader.preshader_params = (uint32 *) m(object->shader.preshader_param_count * sizeof (uint32), d);
                    for (j = 0; j < object->shader.shader->preshader->symbol_count; j++)
                    {
                        object->shader.preshader_params[j] = findparameter(effect->params,
                                                                           effect->param_count,
                                                                           object->shader.shader->preshader->symbols[j].name);
                    } // for
                } // if
            }
        } // if
        else if (object->type == MOJOSHADER_SYMTYPE_SAMPLER
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER1D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER2D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER3D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
        {
            if (length > 0)
            {
                char *str = (char *) m(length, d);
                memcpy(str, *ptr, length);
                object->mapping.name = str;
            } // if
        } // else if
        else if (object->type != MOJOSHADER_SYMTYPE_VOID) // FIXME: Why? -flibit
        {
            assert(0 && "Large object type unknown!");
        } // else

        /* Object block is always a multiple of four */
        const uint32 blocklen = (length + 3) - ((length - 1) % 4);
        *ptr += blocklen;
        *len -= blocklen;
    } // for
}